

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O2

SpatialRigidBodyInertia * __thiscall
RigidBodyDynamics::Math::SpatialRigidBodyInertia::operator+
          (SpatialRigidBodyInertia *__return_storage_ptr__,SpatialRigidBodyInertia *this,
          SpatialRigidBodyInertia *rbi)

{
  double dVar1;
  double dVar2;
  Vector3d *local_30;
  Vector3d *local_28;
  
  dVar1 = this->m;
  dVar2 = rbi->m;
  local_30 = &this->h;
  local_28 = &rbi->h;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&__return_storage_ptr__->h,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_30);
  __return_storage_ptr__->m = dVar1 + dVar2;
  dVar1 = this->Iyx;
  dVar2 = rbi->Iyx;
  __return_storage_ptr__->Ixx = rbi->Ixx + this->Ixx;
  __return_storage_ptr__->Iyx = dVar2 + dVar1;
  dVar1 = this->Izx;
  dVar2 = rbi->Izx;
  __return_storage_ptr__->Iyy = rbi->Iyy + this->Iyy;
  __return_storage_ptr__->Izx = dVar2 + dVar1;
  dVar1 = this->Izz;
  dVar2 = rbi->Izz;
  __return_storage_ptr__->Izy = rbi->Izy + this->Izy;
  __return_storage_ptr__->Izz = dVar2 + dVar1;
  return __return_storage_ptr__;
}

Assistant:

SpatialRigidBodyInertia operator+ (const SpatialRigidBodyInertia &rbi) {
		return SpatialRigidBodyInertia (
				m + rbi.m,
				h + rbi.h,
				Ixx + rbi.Ixx,
				Iyx + rbi.Iyx, Iyy + rbi.Iyy,
				Izx + rbi.Izx, Izy + rbi.Izy, Izz + rbi.Izz
				);
	}